

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
* __thiscall
chaiscript::dispatch::Bound_Function::get_contained_functions
          (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           *__return_storage_ptr__,Bound_Function *this)

{
  initializer_list<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> __l;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *local_78;
  allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> local_39;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> local_38;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> local_28;
  Bound_Function *local_18;
  Bound_Function *this_local;
  
  local_18 = this;
  this_local = (Bound_Function *)__return_storage_ptr__;
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::shared_ptr(&local_38,&this->m_f)
  ;
  local_28.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_28.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&local_38;
  std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::allocator
            (&local_39);
  __l._M_len = (size_type)
               local_28.
               super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_28.
                 super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector(__return_storage_ptr__,__l,&local_39);
  std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::~allocator
            (&local_39);
  local_78 = &local_28;
  do {
    local_78 = local_78 + -1;
    std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_78);
  } while (local_78 != &local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Const_Proxy_Function> get_contained_functions() const override { return std::vector<Const_Proxy_Function>{m_f}; }